

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O3

void highbd_bilinear_filter4xh
               (uint16_t *src,int src_stride,int xoffset,int yoffset,uint16_t *dst,int h)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  undefined2 uVar11;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  auVar12 = _DAT_00513e30;
  if (xoffset == 0) {
    if (-1 < h) {
      lVar9 = 0;
      do {
        *(undefined8 *)(dst + lVar9 * 4) = *(undefined8 *)src;
        src = src + src_stride;
        lVar9 = lVar9 + 1;
      } while (h + 1 != (int)lVar9);
    }
  }
  else if (xoffset == 4) {
    if (-1 < h) {
      lVar9 = 0;
      do {
        uVar11 = pavgw(src[1],*src);
        uVar13 = pavgw(src[2],src[1]);
        uVar14 = pavgw(src[3],src[2]);
        uVar15 = pavgw(src[4],src[3]);
        pavgw(src[5],src[4]);
        pavgw(src[6],src[5]);
        pavgw(src[7],src[6]);
        pavgw(0,src[7]);
        *(ulong *)(dst + lVar9 * 4) = CONCAT26(uVar15,CONCAT24(uVar14,CONCAT22(uVar13,uVar11)));
        src = src + src_stride;
        lVar9 = lVar9 + 1;
      } while (h + 1 != (int)lVar9);
    }
  }
  else {
    uVar5 = (uint)bilinear_filters_2t[xoffset][1] << 0x10 | (uint)bilinear_filters_2t[xoffset][0];
    auVar20._4_4_ = uVar5;
    auVar20._0_4_ = uVar5;
    auVar20._8_4_ = uVar5;
    auVar20._12_4_ = uVar5;
    pauVar6 = (undefined1 (*) [16])dst;
    if (0 < h) {
      iVar10 = 0;
      do {
        auVar22 = pshufb(*(undefined1 (*) [16])src,auVar12);
        auVar22 = pmaddwd(auVar22,auVar20);
        auVar23._0_4_ = auVar22._0_4_ + 0x40U >> 7;
        auVar23._4_4_ = auVar22._4_4_ + 0x40U >> 7;
        auVar23._8_4_ = auVar22._8_4_ + 0x40U >> 7;
        auVar23._12_4_ = auVar22._12_4_ + 0x40U >> 7;
        auVar22 = pshufb(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)src_stride * 2),
                         auVar12);
        auVar22 = pmaddwd(auVar22,auVar20);
        auVar29._0_4_ = auVar22._0_4_ + 0x40U >> 7;
        auVar29._4_4_ = auVar22._4_4_ + 0x40U >> 7;
        auVar29._8_4_ = auVar22._8_4_ + 0x40U >> 7;
        auVar29._12_4_ = auVar22._12_4_ + 0x40U >> 7;
        auVar22 = packssdw(auVar23,auVar29);
        *pauVar6 = auVar22;
        pauVar6 = pauVar6 + 1;
        iVar10 = iVar10 + 2;
        src = (uint16_t *)(*(undefined1 (*) [16])src + (long)(src_stride * 2) * 2);
      } while (iVar10 < h);
    }
    auVar12 = pshufb(*(undefined1 (*) [16])src,_DAT_00513e30);
    auVar12 = pmaddwd(auVar12,auVar20);
    auVar22._0_4_ = auVar12._0_4_ + 0x40U >> 7;
    auVar22._4_4_ = auVar12._4_4_ + 0x40U >> 7;
    auVar22._8_4_ = auVar12._8_4_ + 0x40U >> 7;
    auVar22._12_4_ = auVar12._12_4_ + 0x40U >> 7;
    auVar12 = packssdw(auVar22,auVar22);
    *(long *)*pauVar6 = auVar12._0_8_;
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      if (0 < h) {
        lVar9 = 0;
        uVar7 = *(undefined8 *)dst;
        do {
          uVar3 = *(undefined8 *)(dst + lVar9 * 4 + 4);
          uVar1 = *(undefined8 *)(dst + lVar9 * 4 + 4);
          uVar11 = pavgw((short)uVar1,(short)uVar7);
          uVar13 = pavgw((short)((ulong)uVar1 >> 0x10),(short)((ulong)uVar7 >> 0x10));
          uVar14 = pavgw((short)((ulong)uVar1 >> 0x20),(short)((ulong)uVar7 >> 0x20));
          uVar15 = pavgw((short)((ulong)uVar1 >> 0x30),(short)((ulong)uVar7 >> 0x30));
          pavgw(0,0);
          pavgw(0,0);
          pavgw(0,0);
          pavgw(0,0);
          *(ulong *)(dst + lVar9 * 4) = CONCAT26(uVar15,CONCAT24(uVar14,CONCAT22(uVar13,uVar11)));
          lVar9 = lVar9 + 1;
          uVar7 = uVar3;
        } while (h != (int)lVar9);
      }
    }
    else if (0 < h) {
      uVar5 = (uint)bilinear_filters_2t[yoffset][0] | (uint)bilinear_filters_2t[yoffset][1] << 0x10;
      auVar12._4_4_ = uVar5;
      auVar12._0_4_ = uVar5;
      auVar12._8_4_ = uVar5;
      auVar12._12_4_ = uVar5;
      lVar9 = 0;
      uVar8 = *(ulong *)dst;
      do {
        uVar2 = *(ulong *)(dst + lVar9 * 4 + 4);
        uVar4 = *(ulong *)(dst + lVar9 * 4 + 8);
        uVar14 = (undefined2)(uVar2 >> 0x30);
        auVar19._8_4_ = 0;
        auVar19._0_8_ = uVar8;
        auVar19._12_2_ = (short)(uVar8 >> 0x30);
        auVar19._14_2_ = uVar14;
        auVar18._12_4_ = auVar19._12_4_;
        auVar18._8_2_ = 0;
        auVar18._0_8_ = uVar8;
        uVar13 = (undefined2)(uVar2 >> 0x20);
        auVar18._10_2_ = uVar13;
        auVar17._10_6_ = auVar18._10_6_;
        auVar17._8_2_ = (short)(uVar8 >> 0x20);
        auVar17._0_8_ = uVar8;
        auVar16._8_8_ = auVar17._8_8_;
        uVar11 = (undefined2)(uVar2 >> 0x10);
        auVar16._6_2_ = uVar11;
        auVar16._4_2_ = (short)(uVar8 >> 0x10);
        auVar16._0_2_ = (undefined2)uVar8;
        auVar24._0_2_ = (undefined2)uVar2;
        auVar16._2_2_ = auVar24._0_2_;
        auVar20 = pmaddwd(auVar16,auVar12);
        auVar21._0_4_ = auVar20._0_4_ + 0x40U >> 7;
        auVar21._4_4_ = auVar20._4_4_ + 0x40U >> 7;
        auVar21._8_4_ = auVar20._8_4_ + 0x40U >> 7;
        auVar21._12_4_ = auVar20._12_4_ + 0x40U >> 7;
        auVar27._8_4_ = 0;
        auVar27._0_8_ = uVar2;
        auVar27._12_2_ = uVar14;
        auVar27._14_2_ = (short)(uVar4 >> 0x30);
        auVar26._12_4_ = auVar27._12_4_;
        auVar26._8_2_ = 0;
        auVar26._0_8_ = uVar2;
        auVar26._10_2_ = (short)(uVar4 >> 0x20);
        auVar25._10_6_ = auVar26._10_6_;
        auVar25._8_2_ = uVar13;
        auVar25._0_8_ = uVar2;
        auVar24._8_8_ = auVar25._8_8_;
        auVar24._6_2_ = (short)(uVar4 >> 0x10);
        auVar24._4_2_ = uVar11;
        auVar24._2_2_ = (short)uVar4;
        auVar20 = pmaddwd(auVar24,auVar12);
        auVar28._0_4_ = auVar20._0_4_ + 0x40U >> 7;
        auVar28._4_4_ = auVar20._4_4_ + 0x40U >> 7;
        auVar28._8_4_ = auVar20._8_4_ + 0x40U >> 7;
        auVar28._12_4_ = auVar20._12_4_ + 0x40U >> 7;
        auVar20 = packssdw(auVar21,auVar28);
        *(undefined1 (*) [16])(dst + lVar9 * 4) = auVar20;
        lVar9 = lVar9 + 2;
        uVar8 = uVar4;
      } while ((int)lVar9 < h);
    }
  }
  return;
}

Assistant:

static void highbd_bilinear_filter4xh(const uint16_t *src, int src_stride,
                                      int xoffset, int yoffset, uint16_t *dst,
                                      int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      _mm_storel_epi64((__m128i *)b, x);
      src += src_stride;
      b += 4;
    }
  } else if (xoffset == 4) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadu_si128((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 2);
      _mm_storel_epi64((__m128i *)b, _mm_avg_epu16(x, z));
      src += src_stride;
      b += 4;
    }
  } else {
    uint16_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi32(hfilter[0] | (hfilter[1] << 16));
    for (i = 0; i < h; i += 2) {
      const __m128i x0 = _mm_loadu_si128((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 2);
      const __m128i x1 = _mm_loadu_si128((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 2);
      const __m128i res =
          highbd_filter_block_2rows(&x0, &z0, &x1, &z1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 2;
      b += 8;
    }
    // Process i = h separately
    __m128i x = _mm_loadu_si128((__m128i *)src);
    __m128i z = _mm_srli_si128(x, 2);

    __m128i v0 = _mm_unpacklo_epi16(x, z);
    v0 = _mm_madd_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu32(v0, FILTER_BITS);

    _mm_storel_epi64((__m128i *)b, _mm_packs_epi32(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)dst);
      __m128i y = _mm_loadl_epi64((__m128i *)&dst[4]);
      _mm_storel_epi64((__m128i *)dst, _mm_avg_epu16(x, y));
      dst += 4;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi32(vfilter[0] | (vfilter[1] << 16));
    for (i = 0; i < h; i += 2) {
      const __m128i x = _mm_loadl_epi64((__m128i *)dst);
      const __m128i y = _mm_loadl_epi64((__m128i *)&dst[4]);
      const __m128i z = _mm_loadl_epi64((__m128i *)&dst[8]);
      const __m128i res =
          highbd_filter_block_2rows(&x, &y, &y, &z, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 8;
    }
  }
}